

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

string * __thiscall
helics::helicsNamedPointString_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,string_view pointName,double val)

{
  value_t vVar1;
  json_value jVar2;
  reference pvVar3;
  json namePoint;
  data local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  data local_38;
  data local_20;
  
  local_48._M_str = (char *)pointName._M_len;
  local_58.m_type = null;
  local_58.m_value.object = (object_t *)0x0;
  local_38.m_type = null;
  local_38._1_7_ = 0;
  local_38.m_value.object = (object_t *)0x0;
  local_48._M_len = (size_t)this;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_38,val);
  pvVar3 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_58,"value");
  vVar1 = (pvVar3->m_data).m_type;
  (pvVar3->m_data).m_type = local_38.m_type;
  local_38.m_type = vVar1;
  jVar2 = (pvVar3->m_data).m_value;
  (pvVar3->m_data).m_value.object = (object_t *)local_38.m_value;
  local_38.m_value = jVar2;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_38);
  if ((helics *)local_48._M_len != (helics *)0x0) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_20,&local_48);
    pvVar3 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_58,"name");
    vVar1 = (pvVar3->m_data).m_type;
    (pvVar3->m_data).m_type = local_20.m_type;
    jVar2 = (pvVar3->m_data).m_value;
    (pvVar3->m_data).m_value = local_20.m_value;
    local_20.m_type = vVar1;
    local_20.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_20);
  }
  fileops::generateJsonString(__return_storage_ptr__,(json *)&local_58,true);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string helicsNamedPointString(std::string_view pointName, double val)
{
    nlohmann::json namePoint;
    namePoint["value"] = val;
    if (pointName.empty()) {
    } else {
        namePoint["name"] = pointName;
    }
    return fileops::generateJsonString(namePoint);
}